

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yocto_obj.h
# Opt level: O1

yo_scene * yo__load_mtl(yo_scene *scene,char *filename)

{
  char *__s;
  double dVar1;
  double dVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  char *pcVar6;
  yo_material *pyVar7;
  char *pcVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  char *mtok [10];
  char mline [4096];
  undefined8 local_1098;
  char *local_1088 [9];
  char local_1039 [4105];
  
  __stream = fopen(filename,"rt");
  if (__stream == (FILE *)0x0) {
    scene = (yo_scene *)0x0;
  }
  else {
    __s = local_1039 + 1;
    pcVar6 = fgets(__s,0x1000,__stream);
    if (pcVar6 != (char *)0x0) {
      pyVar7 = (yo_material *)0x0;
      do {
        if (local_1039[1] != '\0') {
          iVar5 = 0;
          pcVar6 = __s;
          cVar3 = local_1039[1];
          do {
            iVar4 = isspace((int)cVar3);
            if (iVar4 == 0) {
              if ((iVar5 == 0) || (pcVar6[-1] == '\0')) {
                local_1088[iVar5] = pcVar6;
                iVar5 = iVar5 + 1;
              }
            }
            else {
              *pcVar6 = '\0';
            }
            pcVar8 = local_1088[0];
            cVar3 = pcVar6[1];
          } while ((cVar3 != '\0') && (pcVar6 = pcVar6 + 1, iVar5 < 10));
          if ((iVar5 != 0) && ((*local_1088[0] != '#' && (*local_1088[0] != '/')))) {
            iVar5 = strcmp(local_1088[0],"newmtl");
            pcVar6 = local_1088[1];
            if (iVar5 == 0) {
              uVar10 = scene->nmaterials;
              if (uVar10 == 0xffffffff) {
                iVar5 = 0;
LAB_0017178f:
                uVar9 = uVar10 - 1 >> 1 | uVar10 - 1;
                uVar9 = uVar9 >> 2 | uVar9;
                uVar9 = uVar9 >> 4 | uVar9;
                uVar9 = uVar9 >> 8 | uVar9;
                if ((int)((uVar9 >> 0x10 | uVar9) + 1) < iVar5) goto LAB_001717be;
              }
              else {
                if (uVar10 != 0) {
                  uVar9 = uVar10 >> 1 | uVar10;
                  uVar9 = uVar9 >> 2 | uVar9;
                  uVar9 = uVar9 >> 4 | uVar9;
                  uVar9 = uVar9 >> 8 | uVar9;
                  iVar5 = (uVar9 >> 0x10 | uVar9) + 1;
                  goto LAB_0017178f;
                }
LAB_001717be:
                if (uVar10 == 0xffffffff) {
                  sVar11 = 0;
                }
                else {
                  uVar10 = uVar10 >> 1 | uVar10;
                  uVar10 = uVar10 >> 2 | uVar10;
                  uVar10 = uVar10 >> 4 | uVar10;
                  uVar10 = uVar10 >> 8 | uVar10;
                  sVar11 = (long)(int)((uVar10 >> 0x10 | uVar10) + 1) * 0xe8;
                }
                pyVar7 = (yo_material *)realloc(scene->materials,sVar11);
                scene->materials = pyVar7;
                uVar10 = scene->nmaterials;
                if ((long)(int)uVar10 == -1) {
                  iVar5 = 0;
                }
                else {
                  uVar9 = uVar10 >> 1 | uVar10;
                  uVar9 = uVar9 >> 2 | uVar9;
                  uVar9 = uVar9 >> 4 | uVar9;
                  uVar9 = uVar9 >> 8 | uVar9;
                  iVar5 = (uVar9 >> 0x10 | uVar9) + 1;
                }
                memset(pyVar7 + (int)uVar10,0,(long)(int)(iVar5 - uVar10) * 0xe8);
              }
              iVar5 = scene->nmaterials;
              scene->nmaterials = iVar5 + 1;
              pyVar7 = scene->materials;
              if (pcVar6 == (char *)0x0) {
                pcVar8 = (char *)0x0;
              }
              else {
                sVar11 = strlen(pcVar6);
                pcVar8 = (char *)calloc(sVar11 + 1,1);
                strcpy(pcVar8,pcVar6);
              }
              pyVar7 = pyVar7 + iVar5;
              pyVar7->name = pcVar8;
            }
            else {
              iVar5 = strcmp(pcVar8,"illum");
              if (iVar5 == 0) {
                iVar5 = atoi(local_1088[1]);
                pyVar7->illum = iVar5;
              }
              else {
                iVar5 = strcmp(pcVar8,"Ke");
                if (iVar5 == 0) {
                  dVar2 = atof(local_1088[1]);
                  dVar1 = atof(local_1088[2]);
                  local_1098 = CONCAT44((float)dVar1,(float)dVar2);
                  dVar2 = atof(local_1088[3]);
                  *(undefined8 *)pyVar7->ke = local_1098;
                  pyVar7->ke[2] = (float)dVar2;
                }
                else {
                  iVar5 = strcmp(pcVar8,"Ka");
                  if (iVar5 == 0) {
                    dVar2 = atof(local_1088[1]);
                    dVar1 = atof(local_1088[2]);
                    local_1098 = CONCAT44((float)dVar1,(float)dVar2);
                    dVar2 = atof(local_1088[3]);
                    *(undefined8 *)pyVar7->ka = local_1098;
                    pyVar7->ka[2] = (float)dVar2;
                  }
                  else {
                    iVar5 = strcmp(pcVar8,"Kd");
                    if (iVar5 == 0) {
                      dVar2 = atof(local_1088[1]);
                      dVar1 = atof(local_1088[2]);
                      local_1098 = CONCAT44((float)dVar1,(float)dVar2);
                      dVar2 = atof(local_1088[3]);
                      *(undefined8 *)pyVar7->kd = local_1098;
                      pyVar7->kd[2] = (float)dVar2;
                    }
                    else {
                      iVar5 = strcmp(pcVar8,"Ks");
                      if (iVar5 == 0) {
                        dVar2 = atof(local_1088[1]);
                        dVar1 = atof(local_1088[2]);
                        local_1098 = CONCAT44((float)dVar1,(float)dVar2);
                        dVar2 = atof(local_1088[3]);
                        *(undefined8 *)pyVar7->ks = local_1098;
                        pyVar7->ks[2] = (float)dVar2;
                      }
                      else {
                        iVar5 = strcmp(pcVar8,"Kr");
                        if (iVar5 == 0) {
                          dVar2 = atof(local_1088[1]);
                          dVar1 = atof(local_1088[2]);
                          local_1098 = CONCAT44((float)dVar1,(float)dVar2);
                          dVar2 = atof(local_1088[3]);
                          *(undefined8 *)pyVar7->kr = local_1098;
                          pyVar7->kr[2] = (float)dVar2;
                        }
                        else {
                          iVar5 = strcmp(pcVar8,"Tr");
                          if (iVar5 == 0) {
                            dVar2 = atof(local_1088[1]);
                            dVar1 = atof(local_1088[2]);
                            local_1098 = CONCAT44((float)dVar1,(float)dVar2);
                            dVar2 = atof(local_1088[3]);
                            *(undefined8 *)pyVar7->kt = local_1098;
                            pyVar7->kt[2] = (float)dVar2;
                          }
                          else {
                            iVar5 = strcmp(pcVar8,"Ns");
                            if (iVar5 == 0) {
                              dVar2 = atof(local_1088[1]);
                              pyVar7->ns = (float)dVar2;
                            }
                            else {
                              iVar5 = strcmp(pcVar8,"d");
                              if (iVar5 == 0) {
                                dVar2 = atof(local_1088[1]);
                                pyVar7->op = (float)dVar2;
                              }
                              else {
                                iVar5 = strcmp(pcVar8,"Ni");
                                if (iVar5 == 0) {
                                  dVar2 = atof(local_1088[1]);
                                  pyVar7->ior = (float)dVar2;
                                }
                                else {
                                  iVar5 = strcmp(pcVar8,"map_Ke");
                                  if (iVar5 == 0) {
                                    pcVar6 = yo__strdup(local_1088[1]);
                                    pyVar7->ke_txt = pcVar6;
                                  }
                                  else {
                                    iVar5 = strcmp(pcVar8,"map_Ka");
                                    if (iVar5 == 0) {
                                      pcVar6 = yo__strdup(local_1088[1]);
                                      pyVar7->ka_txt = pcVar6;
                                    }
                                    else {
                                      iVar5 = strcmp(pcVar8,"map_Kd");
                                      if (iVar5 == 0) {
                                        pcVar6 = yo__strdup(local_1088[1]);
                                        pyVar7->kd_txt = pcVar6;
                                      }
                                      else {
                                        iVar5 = strcmp(pcVar8,"map_Ks");
                                        if (iVar5 == 0) {
                                          pcVar6 = yo__strdup(local_1088[1]);
                                          pyVar7->ks_txt = pcVar6;
                                        }
                                        else {
                                          iVar5 = strcmp(pcVar8,"map_Kr");
                                          if (iVar5 == 0) {
                                            pcVar6 = yo__strdup(local_1088[1]);
                                            pyVar7->kr_txt = pcVar6;
                                          }
                                          else {
                                            iVar5 = strcmp(pcVar8,"map_Tr");
                                            if (iVar5 == 0) {
                                              pcVar6 = yo__strdup(local_1088[1]);
                                              pyVar7->kt_txt = pcVar6;
                                            }
                                            else {
                                              iVar5 = strcmp(pcVar8,"map_Ns");
                                              if (iVar5 == 0) {
                                                pcVar6 = yo__strdup(local_1088[1]);
                                                pyVar7->ns_txt = pcVar6;
                                              }
                                              else {
                                                iVar5 = strcmp(pcVar8,"map_d");
                                                if (iVar5 == 0) {
                                                  pcVar6 = yo__strdup(local_1088[1]);
                                                  pyVar7->op_txt = pcVar6;
                                                }
                                                else {
                                                  iVar5 = strcmp(pcVar8,"map_Ni");
                                                  if (iVar5 == 0) {
                                                    pcVar6 = yo__strdup(local_1088[1]);
                                                    pyVar7->ior_txt = pcVar6;
                                                  }
                                                  else {
                                                    iVar5 = strcmp(pcVar8,"map_bump");
                                                    if (iVar5 == 0) {
                                                      pcVar6 = yo__strdup(local_1088[1]);
                                                      pyVar7->bump_txt = pcVar6;
                                                    }
                                                    else {
                                                      iVar5 = strcmp(pcVar8,"map_disp");
                                                      if (iVar5 == 0) {
                                                        pcVar6 = yo__strdup(local_1088[1]);
                                                        pyVar7->disp_txt = pcVar6;
                                                      }
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        pcVar6 = fgets(__s,0x1000,__stream);
      } while (pcVar6 != (char *)0x0);
    }
    fclose(__stream);
  }
  return scene;
}

Assistant:

static inline yo_scene*
yo__load_mtl(yo_scene* scene, const char* filename) {
    FILE* mfile = fopen(filename, "rt");
    if (!mfile) return 0;

    char mline[4096];
    char* mtok[10];
    int mlinenum = 0;

    yo_material* mat = 0;

    // foreach line, splits the line by whitespaces and parses the data
    // directly in the material
    while (fgets(mline, 4096, mfile)) {
        mlinenum += 1;
        int mntok = yo__splitws(mline, mtok, 10);

        if (!mntok) {
            continue;
        } else if (mtok[0][0] == '#' || mtok[0][0] == '/') {
            continue;
        } else if (!strcmp(mtok[0], "newmtl")) {
            yo__add_empty_material(scene, mtok[1]);
            mat = &scene->materials[scene->nmaterials - 1];
        } else if (!strcmp(mtok[0], "illum")) {
            mat->illum = atoi(mtok[1]);
        } else if (!strcmp(mtok[0], "Ke")) {
            *(yo__vec3f*)mat->ke = yo__parse_float3(mtok + 1);
        } else if (!strcmp(mtok[0], "Ka")) {
            *(yo__vec3f*)mat->ka = yo__parse_float3(mtok + 1);
        } else if (!strcmp(mtok[0], "Kd")) {
            *(yo__vec3f*)mat->kd = yo__parse_float3(mtok + 1);
        } else if (!strcmp(mtok[0], "Ks")) {
            *(yo__vec3f*)mat->ks = yo__parse_float3(mtok + 1);
        } else if (!strcmp(mtok[0], "Kr")) {
            *(yo__vec3f*)mat->kr = yo__parse_float3(mtok + 1);
        } else if (!strcmp(mtok[0], "Tr")) {
            *(yo__vec3f*)mat->kt = yo__parse_float3(mtok + 1);
        } else if (!strcmp(mtok[0], "Ns")) {
            mat->ns = yo__parse_float(mtok + 1);
        } else if (!strcmp(mtok[0], "d")) {
            mat->op = yo__parse_float(mtok + 1);
        } else if (!strcmp(mtok[0], "Tr")) {
            mat->op = yo__parse_float(mtok + 1);
        } else if (!strcmp(mtok[0], "Ni")) {
            mat->ior = yo__parse_float(mtok + 1);
        } else if (!strcmp(mtok[0], "map_Ke")) {
            mat->ke_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Ka")) {
            mat->ka_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Kd")) {
            mat->kd_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Ks")) {
            mat->ks_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Kr")) {
            mat->kr_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Tr")) {
            mat->kt_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Ns")) {
            mat->ns_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_d")) {
            mat->op_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Tr")) {
            mat->op_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Ni")) {
            mat->ior_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_bump")) {
            mat->bump_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_disp")) {
            mat->disp_txt = yo__strdup(mtok[1]);
        } else {
            // printf("ignoring value for %s\n", mtok[0]);
        }
    }

    fclose(mfile);

    return scene;
}